

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QXdgDBusImageStruct>::emplace<QXdgDBusImageStruct_const&>
          (QMovableArrayOps<QXdgDBusImageStruct> *this,qsizetype i,QXdgDBusImageStruct *args)

{
  QXdgDBusImageStruct **ppQVar1;
  QXdgDBusImageStruct *pQVar2;
  undefined4 uVar3;
  Data *pDVar4;
  long lVar5;
  undefined4 uVar10;
  Data *pDVar6;
  char *pcVar7;
  qsizetype qVar8;
  QXdgDBusImageStruct *pQVar9;
  int iVar11;
  qsizetype *pqVar12;
  bool bVar13;
  
  pDVar4 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
           super_QArrayDataPointer<QXdgDBusImageStruct>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0065cd3d:
    uVar3 = args->width;
    uVar10 = args->height;
    pDVar6 = (args->data).d.d;
    pcVar7 = (args->data).d.ptr;
    qVar8 = (args->data).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar13 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.size != 0;
    QArrayDataPointer<QXdgDBusImageStruct>::detachAndGrow
              ((QArrayDataPointer<QXdgDBusImageStruct> *)this,(uint)(i == 0 && bVar13),1,
               (QXdgDBusImageStruct **)0x0,(QArrayDataPointer<QXdgDBusImageStruct> *)0x0);
    pQVar9 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
    if (i != 0 || !bVar13) {
      pQVar2 = pQVar9 + i;
      memmove(pQVar2 + 1,pQVar9 + i,
              ((this->super_QGenericArrayOps<QXdgDBusImageStruct>).
               super_QArrayDataPointer<QXdgDBusImageStruct>.size - i) * 0x20);
      pQVar2->width = uVar3;
      pQVar2->height = uVar10;
      (pQVar2->data).d.d = pDVar6;
      (pQVar2->data).d.ptr = pcVar7;
      (pQVar2->data).d.size = qVar8;
      goto LAB_0065cdf5;
    }
    pQVar9[-1].width = uVar3;
    pQVar9[-1].height = uVar10;
    pQVar9[-1].data.d.d = pDVar6;
    pQVar9[-1].data.d.ptr = pcVar7;
    pQVar9[-1].data.d.size = qVar8;
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
            super_QArrayDataPointer<QXdgDBusImageStruct>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                      super_QArrayDataPointer<QXdgDBusImageStruct>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
        lVar5)) {
      pQVar9 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
               super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
      iVar11 = args->height;
      pQVar9[lVar5].width = args->width;
      pQVar9[lVar5].height = iVar11;
      pDVar6 = (args->data).d.d;
      pQVar9[lVar5].data.d.d = pDVar6;
      pQVar9[lVar5].data.d.ptr = (args->data).d.ptr;
      pQVar9[lVar5].data.d.size = (args->data).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0065cdf5;
    }
    if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
       ((QXdgDBusImageStruct *)
        ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
        (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
        super_QArrayDataPointer<QXdgDBusImageStruct>.ptr)) goto LAB_0065cd3d;
    pQVar9 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
    iVar11 = args->height;
    pQVar9[-1].width = args->width;
    pQVar9[-1].height = iVar11;
    pDVar6 = (args->data).d.d;
    pQVar9[-1].data.d.d = pDVar6;
    pQVar9[-1].data.d.ptr = (args->data).d.ptr;
    pQVar9[-1].data.d.size = (args->data).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_0065cdf5:
  pqVar12 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.size;
  *pqVar12 = *pqVar12 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }